

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

int epoll_nochangelist_del(event_base *base,int fd,short old,short events,void *p)

{
  undefined3 uVar1;
  byte bVar2;
  int iVar3;
  undefined2 in_register_0000000a;
  undefined6 in_register_00000012;
  event_change *ch_00;
  event_change ch;
  int local_c;
  short local_8;
  undefined1 local_6;
  undefined1 uStack_5;
  byte local_4;
  
  ch_00 = (event_change *)CONCAT62(in_register_00000012,old);
  local_4 = 0;
  uStack_5 = 0;
  bVar2 = (byte)events;
  uVar1 = (undefined3)(CONCAT22(in_register_0000000a,events) >> 8);
  if ((events & 4U) != 0) {
    ch_00 = (event_change *)((ulong)CONCAT31(uVar1,bVar2) & 0xffffffffffffff20 | 2);
    uStack_5 = SUB81(ch_00,0);
  }
  local_6 = 0;
  if ((events & 2U) != 0) {
    ch_00 = (event_change *)((ulong)CONCAT31(uVar1,bVar2) & 0xffffffffffffff22);
    local_6 = SUB81(ch_00,0);
  }
  if ((char)bVar2 < '\0') {
    local_4 = bVar2 & 0x20 | 2;
  }
  local_c = fd;
  local_8 = old;
  iVar3 = epoll_apply_one_change
                    ((event_base *)base->evbase,(epollop *)&stack0xfffffffffffffff4,ch_00);
  return iVar3;
}

Assistant:

static int
epoll_nochangelist_del(struct event_base *base, evutil_socket_t fd,
    short old, short events, void *p)
{
	struct event_change ch;
	ch.fd = fd;
	ch.old_events = old;
	ch.read_change = ch.write_change = ch.close_change = 0;
	if (events & EV_WRITE)
		ch.write_change = EV_CHANGE_DEL |
		    (events & EV_ET);
	if (events & EV_READ)
		ch.read_change = EV_CHANGE_DEL |
		    (events & EV_ET);
	if (events & EV_CLOSED)
		ch.close_change = EV_CHANGE_DEL |
		    (events & EV_ET);

	return epoll_apply_one_change(base, base->evbase, &ch);
}